

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O0

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties
               (cmGeneratorTarget *target,ostream *os,ImportPropertyMap *properties,
               GenerateType type,string *config)

{
  pointer *arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmMakefile *this;
  PolicyStatus PVar2;
  TargetType TVar3;
  ostream *poVar4;
  string *psVar5;
  reference __lhs;
  cmLinkInterfaceLibraries *this_00;
  ulong uVar6;
  bool bVar7;
  byte local_48b;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_438;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_430;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_428;
  cmLinkImplementation *local_420;
  cmLinkImplementation *li;
  undefined1 local_3f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkFlagsList;
  string *i;
  iterator __end6;
  iterator __begin6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6;
  string end;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeList;
  string includes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  byte local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  byte local_2d9;
  undefined1 local_2d8 [7];
  bool relpath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string *local_298;
  string *lib;
  cmGeneratorTarget *gt;
  cmLinkItem *item;
  const_iterator __end5;
  const_iterator __begin5;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range5;
  cmLinkInterfaceLibraries *linkIFace;
  string ldlibs;
  string sharedLibs;
  string staticLibs;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *property;
  const_iterator __end2;
  const_iterator __begin2;
  ImportPropertyMap *__range2;
  undefined1 local_1b0 [8];
  ostringstream w;
  bool newCMP0022Behavior;
  string *config_local;
  GenerateType type_local;
  ImportPropertyMap *properties_local;
  ostream *os_local;
  cmGeneratorTarget *target_local;
  
  PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
  bVar7 = false;
  if (PVar2 != WARN) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
    bVar7 = PVar2 != OLD;
  }
  if (!bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    if (type == BUILD) {
      std::operator<<((ostream *)local_1b0,
                      "export(TARGETS ... ANDROID_MK) called with policy CMP0022");
    }
    else {
      std::operator<<((ostream *)local_1b0,
                      "install( EXPORT_ANDROID_MK ...) called with policy CMP0022");
    }
    poVar4 = std::operator<<((ostream *)local_1b0," set to OLD for target ");
    psVar5 = cmTarget::GetName_abi_cxx11_(target->Target);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4,". ");
    std::operator<<(poVar4,"The export will only work with CMP0022 set to NEW.");
    this = target->Makefile;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(this,AUTHOR_WARNING,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  }
  bVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(properties);
  if (!bVar7) {
    std::operator<<(os,"LOCAL_CPP_FEATURES := rtti exceptions\n");
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(properties);
    property = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(properties);
    while (bVar7 = std::operator!=(&__end2,(_Self *)&property), bVar7) {
      __lhs = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator*(&__end2);
      bVar7 = std::operator==(&__lhs->first,"INTERFACE_COMPILE_OPTIONS");
      if (bVar7) {
        std::operator<<(os,"LOCAL_CPP_FEATURES += ");
        poVar4 = std::operator<<(os,(string *)&__lhs->second);
        std::operator<<(poVar4,"\n");
      }
      else {
        bVar7 = std::operator==(&__lhs->first,"INTERFACE_LINK_LIBRARIES");
        if (bVar7) {
          std::__cxx11::string::string((string *)(sharedLibs.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(ldlibs.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&linkIFace);
          this_00 = cmGeneratorTarget::GetLinkInterfaceLibraries(target,config,target,false);
          __end5 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(&this_00->Libraries);
          item = (cmLinkItem *)
                 std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(&this_00->Libraries);
          while (bVar7 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                             *)&item), bVar7) {
            gt = (cmGeneratorTarget *)
                 __gnu_cxx::
                 __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                 ::operator*(&__end5);
            lib = *(string **)&gt->ObjectDirectory;
            local_298 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)gt);
            if (lib == (string *)0x0) {
              local_2d9 = 0;
              if (type == INSTALL) {
                std::__cxx11::string::substr((ulong)&local_300,(ulong)local_298);
                local_2d9 = std::operator==(&local_300,"../");
                std::__cxx11::string::~string((string *)&local_300);
              }
              local_321 = 0;
              bVar7 = cmsys::SystemTools::FileIsFullPath(local_298);
              local_48b = 1;
              if (!bVar7) {
                std::__cxx11::string::substr((ulong)&local_320,(ulong)local_298);
                local_321 = 1;
                bVar7 = std::operator==(&local_320,"-l");
                local_48b = 1;
                if (!bVar7) {
                  local_48b = local_2d9;
                }
              }
              if ((local_321 & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_320);
              }
              if ((local_48b & 1) == 0) {
                uVar6 = std::__cxx11::string::empty();
                if ((uVar6 & 1) == 0) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&includes.field_2 + 8)," -l",local_298);
                  std::__cxx11::string::operator+=
                            ((string *)&linkIFace,(string *)(includes.field_2._M_local_buf + 8));
                  std::__cxx11::string::~string((string *)(includes.field_2._M_local_buf + 8));
                }
              }
              else {
                std::operator+(&local_348," ",local_298);
                std::__cxx11::string::operator+=((string *)&linkIFace,(string *)&local_348);
                std::__cxx11::string::~string((string *)&local_348);
              }
            }
            else {
              TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lib);
              if ((TVar3 == SHARED_LIBRARY) ||
                 (TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lib),
                 TVar3 == MODULE_LIBRARY)) {
                std::operator+(&local_2b8," ",local_298);
                std::__cxx11::string::operator+=
                          ((string *)(ldlibs.field_2._M_local_buf + 8),(string *)&local_2b8);
                std::__cxx11::string::~string((string *)&local_2b8);
              }
              else {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2d8," ",local_298);
                std::__cxx11::string::operator+=
                          ((string *)(sharedLibs.field_2._M_local_buf + 8),(string *)local_2d8);
                std::__cxx11::string::~string((string *)local_2d8);
              }
            }
            __gnu_cxx::
            __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
            ::operator++(&__end5);
          }
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            poVar4 = std::operator<<(os,"LOCAL_SHARED_LIBRARIES :=");
            poVar4 = std::operator<<(poVar4,(string *)(ldlibs.field_2._M_local_buf + 8));
            std::operator<<(poVar4,"\n");
          }
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            poVar4 = std::operator<<(os,"LOCAL_STATIC_LIBRARIES :=");
            poVar4 = std::operator<<(poVar4,(string *)(sharedLibs.field_2._M_local_buf + 8));
            std::operator<<(poVar4,"\n");
          }
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            poVar4 = std::operator<<(os,"LOCAL_EXPORT_LDLIBS :=");
            poVar4 = std::operator<<(poVar4,(string *)&linkIFace);
            std::operator<<(poVar4,"\n");
          }
          std::__cxx11::string::~string((string *)&linkIFace);
          std::__cxx11::string::~string((string *)(ldlibs.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(sharedLibs.field_2._M_local_buf + 8));
        }
        else {
          bVar7 = std::operator==(&__lhs->first,"INTERFACE_INCLUDE_DIRECTORIES");
          if (bVar7) {
            arg = &includeList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::string((string *)arg,(string *)&__lhs->second);
            pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&end.field_2 + 8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(pvVar1);
            cmSystemTools::ExpandListArgument((string *)arg,pvVar1,false);
            std::operator<<(os,"LOCAL_EXPORT_C_INCLUDES := ");
            std::__cxx11::string::string((string *)&__range6);
            pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&end.field_2 + 8);
            __end6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(pvVar1);
            i = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(pvVar1);
            while (bVar7 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&i), bVar7) {
              linkFlagsList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end6);
              poVar4 = std::operator<<(os,(string *)&__range6);
              std::operator<<(poVar4,(string *)
                                     linkFlagsList.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::operator=((string *)&__range6,"\\\n");
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end6);
            }
            std::operator<<(os,"\n");
            std::__cxx11::string::~string((string *)&__range6);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&end.field_2 + 8));
            std::__cxx11::string::~string
                      ((string *)
                       &includeList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            bVar7 = std::operator==(&__lhs->first,"INTERFACE_LINK_OPTIONS");
            if (bVar7) {
              std::operator<<(os,"LOCAL_EXPORT_LDFLAGS := ");
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3f8);
              cmSystemTools::ExpandListArgument
                        (&__lhs->second,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_3f8,false);
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)&li,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_3f8," ");
              poVar4 = std::operator<<(os,(string *)&li);
              std::operator<<(poVar4,"\n");
              std::__cxx11::string::~string((string *)&li);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_3f8);
            }
            else {
              poVar4 = std::operator<<(os,"# ");
              poVar4 = std::operator<<(poVar4,(string *)__lhs);
              poVar4 = std::operator<<(poVar4," ");
              poVar4 = std::operator<<(poVar4,(string *)&__lhs->second);
              std::operator<<(poVar4,"\n");
            }
          }
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
  }
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 == STATIC_LIBRARY) {
    local_420 = cmGeneratorTarget::GetLinkImplementation(target,config);
    local_430._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&local_420->Languages);
    local_438 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&local_420->Languages);
    local_428 = std::
                find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[4]>
                          (local_430,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_438,(char (*) [4])0x8bd402);
    local_440._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&local_420->Languages);
    bVar7 = __gnu_cxx::operator!=(&local_428,&local_440);
    if (bVar7) {
      std::operator<<(os,"LOCAL_HAS_CPP := true\n");
    }
  }
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 != EXECUTABLE) {
    if (TVar3 == STATIC_LIBRARY) {
      std::operator<<(os,"include $(PREBUILT_STATIC_LIBRARY)\n");
    }
    else if (TVar3 - SHARED_LIBRARY < 2) {
      std::operator<<(os,"include $(PREBUILT_SHARED_LIBRARY)\n");
    }
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
  const cmGeneratorTarget* target, std::ostream& os,
  const ImportPropertyMap& properties, GenerateType type,
  std::string const& config)
{
  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;
  if (!newCMP0022Behavior) {
    std::ostringstream w;
    if (type == cmExportBuildAndroidMKGenerator::BUILD) {
      w << "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    } else {
      w << "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    }
    w << " set to OLD for target " << target->Target->GetName() << ". "
      << "The export will only work with CMP0022 set to NEW.";
    target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }
  if (!properties.empty()) {
    os << "LOCAL_CPP_FEATURES := rtti exceptions\n";
    for (auto const& property : properties) {
      if (property.first == "INTERFACE_COMPILE_OPTIONS") {
        os << "LOCAL_CPP_FEATURES += ";
        os << (property.second) << "\n";
      } else if (property.first == "INTERFACE_LINK_LIBRARIES") {
        std::string staticLibs;
        std::string sharedLibs;
        std::string ldlibs;
        cmLinkInterfaceLibraries const* linkIFace =
          target->GetLinkInterfaceLibraries(config, target, false);
        for (cmLinkItem const& item : linkIFace->Libraries) {
          cmGeneratorTarget const* gt = item.Target;
          std::string const& lib = item.AsStr();
          if (gt) {

            if (gt->GetType() == cmStateEnums::SHARED_LIBRARY ||
                gt->GetType() == cmStateEnums::MODULE_LIBRARY) {
              sharedLibs += " " + lib;
            } else {
              staticLibs += " " + lib;
            }
          } else {
            bool relpath = false;
            if (type == cmExportBuildAndroidMKGenerator::INSTALL) {
              relpath = lib.substr(0, 3) == "../";
            }
            // check for full path or if it already has a -l, or
            // in the case of an install check for relative paths
            // if it is full or a link library then use string directly
            if (cmSystemTools::FileIsFullPath(lib) ||
                lib.substr(0, 2) == "-l" || relpath) {
              ldlibs += " " + lib;
              // if it is not a path and does not have a -l then add -l
            } else if (!lib.empty()) {
              ldlibs += " -l" + lib;
            }
          }
        }
        if (!sharedLibs.empty()) {
          os << "LOCAL_SHARED_LIBRARIES :=" << sharedLibs << "\n";
        }
        if (!staticLibs.empty()) {
          os << "LOCAL_STATIC_LIBRARIES :=" << staticLibs << "\n";
        }
        if (!ldlibs.empty()) {
          os << "LOCAL_EXPORT_LDLIBS :=" << ldlibs << "\n";
        }
      } else if (property.first == "INTERFACE_INCLUDE_DIRECTORIES") {
        std::string includes = property.second;
        std::vector<std::string> includeList;
        cmSystemTools::ExpandListArgument(includes, includeList);
        os << "LOCAL_EXPORT_C_INCLUDES := ";
        std::string end;
        for (std::string const& i : includeList) {
          os << end << i;
          end = "\\\n";
        }
        os << "\n";
      } else if (property.first == "INTERFACE_LINK_OPTIONS") {
        os << "LOCAL_EXPORT_LDFLAGS := ";
        std::vector<std::string> linkFlagsList;
        cmSystemTools::ExpandListArgument(property.second, linkFlagsList);
        os << cmJoin(linkFlagsList, " ") << "\n";
      } else {
        os << "# " << property.first << " " << (property.second) << "\n";
      }
    }
  }

  // Tell the NDK build system if prebuilt static libraries use C++.
  if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
    cmLinkImplementation const* li = target->GetLinkImplementation(config);
    if (std::find(li->Languages.begin(), li->Languages.end(), "CXX") !=
        li->Languages.end()) {
      os << "LOCAL_HAS_CPP := true\n";
    }
  }

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      os << "include $(PREBUILT_SHARED_LIBRARY)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "include $(PREBUILT_STATIC_LIBRARY)\n";
      break;
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::UTILITY:
    case cmStateEnums::OBJECT_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
  os << "\n";
}